

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O0

void __thiscall
boost::python::
class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
::
def_impl<AbstractModuleClient,void(AbstractModuleClient::*)(std::__cxx11::string,unsigned_int),boost::python::detail::def_helper<void(PythonModuleClient::*)(std::__cxx11::string,unsigned_int),boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
          (class_<PythonModuleClient,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
           *this,AbstractModuleClient *param_2,char *name,first_type fn,
          def_helper<void_(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
          *helper,...)

{
  char *pcVar1;
  vector4<void,_AbstractModuleClient_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *in_RCX;
  char *in_RDX;
  undefined8 in_RSI;
  def_helper<void_(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  *in_RDI;
  AbstractModuleClient *in_R8;
  undefined8 in_R9;
  default_call_policies *in_stack_ffffffffffffff98;
  vector4<void,_AbstractModuleClient_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *f;
  object local_48;
  undefined8 local_40;
  vector4<void,_AbstractModuleClient_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_38;
  AbstractModuleClient *local_30;
  char *local_28;
  undefined8 local_20;
  def_helper<void_(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  *local_18;
  vector4<void,_AbstractModuleClient_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_10;
  AbstractModuleClient *local_8;
  
  local_40 = in_R9;
  local_38 = in_RCX;
  local_30 = in_R8;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  local_10 = in_RCX;
  local_8 = in_R8;
  detail::
  def_helper<void_(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::policies(in_RDI);
  detail::
  def_helper<void_(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::keywords(in_RDI);
  f = local_38;
  detail::
  get_signature<AbstractModuleClient,void,AbstractModuleClient,std::__cxx11::string,unsigned_int>
            ((first_type)local_38,local_30);
  make_function<void(AbstractModuleClient::*)(std::__cxx11::string,unsigned_int),boost::python::default_call_policies,boost::python::detail::keywords<0ul>,boost::mpl::vector4<void,AbstractModuleClient&,std::__cxx11::string,unsigned_int>>
            ((first_type)f,in_stack_ffffffffffffff98,(keywords<0UL> *)in_R8,in_RCX);
  pcVar1 = detail::
           def_helper<void_(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
           ::doc((def_helper<void_(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
                  *)0x3e7f99);
  objects::add_to_namespace((object *)in_RDI,in_RDX,&local_48,pcVar1);
  api::object::~object((object *)0x3e7fcb);
  def_default<void(AbstractModuleClient::*)(std::__cxx11::string,unsigned_int),boost::python::detail::def_helper<void(PythonModuleClient::*)(std::__cxx11::string,unsigned_int),boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
            ((class_<PythonModuleClient,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_RDI,local_28,local_38,local_30,local_40);
  return;
}

Assistant:

inline void def_impl(
        T*
      , char const* name
      , Fn fn
      , Helper const& helper
      , ...
    )
    {
        objects::add_to_namespace(
            *this
          , name
          , make_function(
                fn
              , helper.policies()
              , helper.keywords()
              , detail::get_signature(fn, (T*)0)
            )
          , helper.doc()
        );

        this->def_default(name, fn, helper, mpl::bool_<Helper::has_default_implementation>());
    }